

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall soplex::SPxSteepPR<double>::setType(SPxSteepPR<double> *this,Type type)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  peVar1 = (this->super_SPxPricer<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20._M_pi =
       (this->super_SPxPricer<double>)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  (this->workRhs)._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->workRhs)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_20);
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  setupWeights(this,type);
  SSVectorBase<double>::clear(&this->workVec);
  SSVectorBase<double>::clear(&this->workRhs);
  this->refined = false;
  (this->bestPrices).super_IdxSet.num = 0;
  DIdxSet::setMax(&this->bestPrices,
                  (((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
  std::
  vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ::resize(&(this->prices).data,
           (long)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
  if (type == ENTER) {
    (this->bestPricesCo).super_IdxSet.num = 0;
    DIdxSet::setMax(&this->bestPricesCo,
                    (((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum);
    std::
    vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
    ::resize(&(this->pricesCo).data,
             (long)(((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum);
  }
  return;
}

Assistant:

void SPxSteepPR<R>::setType(typename SPxSolverBase<R>::Type type)
{
   workRhs.setTolerances(this->_tolerances);

   setupWeights(type);
   workVec.clear();
   workRhs.clear();
   refined = false;

   bestPrices.clear();
   bestPrices.setMax(this->thesolver->dim());
   prices.reSize(this->thesolver->dim());

   if(type == SPxSolverBase<R>::ENTER)
   {
      bestPricesCo.clear();
      bestPricesCo.setMax(this->thesolver->coDim());
      pricesCo.reSize(this->thesolver->coDim());
   }
}